

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Vector<float,_3>_>::doExecute
          (VariableStatement<tcu::Vector<float,_3>_> *this,EvalContext *ctx)

{
  Environment *pEVar1;
  Variable<tcu::Vector<float,_3>_> *pVVar2;
  Expr<tcu::Vector<float,_3>_> *pEVar3;
  IVal *__dest;
  IVal local_a8;
  IVal local_60;
  EvalContext *local_18;
  EvalContext *ctx_local;
  VariableStatement<tcu::Vector<float,_3>_> *this_local;
  
  local_18 = ctx;
  ctx_local = (EvalContext *)this;
  if ((this->m_isDeclaration & 1U) == 0) {
    pEVar3 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>::
             operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>
                         *)&this->m_value);
    Expr<tcu::Vector<float,_3>_>::evaluate(&local_a8,pEVar3,local_18);
    pEVar1 = local_18->env;
    pVVar2 = de::
             SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>::
             operator*(&(this->m_variable).
                        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                      );
    __dest = Environment::lookup<tcu::Vector<float,3>>(pEVar1,pVVar2);
    memcpy(__dest,&local_a8,0x48);
  }
  else {
    pEVar1 = ctx->env;
    pVVar2 = de::
             SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>::
             operator*(&(this->m_variable).
                        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                      );
    pEVar3 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>::
             operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>
                         *)&this->m_value);
    Expr<tcu::Vector<float,_3>_>::evaluate(&local_60,pEVar3,local_18);
    Environment::bind<tcu::Vector<float,3>>(pEVar1,pVVar2,&local_60);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}